

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

QList<QMdiSubWindow_*> * __thiscall
QMdiAreaPrivate::subWindowList
          (QList<QMdiSubWindow_*> *__return_storage_ptr__,QMdiAreaPrivate *this,WindowOrder order,
          bool reversed)

{
  int iVar1;
  QPointer<QMdiSubWindow> *pQVar2;
  long lVar3;
  long lVar4;
  Data *pDVar5;
  bool bVar6;
  uint uVar7;
  QObject *pQVar8;
  long lVar9;
  QObject *pQVar10;
  long lVar11;
  long lVar12;
  long in_FS_OFFSET;
  QObject *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QMdiSubWindow **)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar12 = (this->childWindows).d.size;
  if (lVar12 != 0) {
    if (order == StackingOrder) {
      lVar12 = *(long *)&((this->super_QAbstractScrollAreaPrivate).viewport)->field_0x8;
      lVar11 = *(long *)(lVar12 + 0x28);
      if (lVar11 != 0) {
        lVar12 = *(long *)(lVar12 + 0x20);
        lVar11 = lVar11 * 8 + lVar12;
        do {
          pQVar8 = (QObject *)QMetaObject::cast((QObject *)&QMdiSubWindow::staticMetaObject);
          if ((pQVar8 != (QObject *)0x0) && (lVar3 = (this->childWindows).d.size, lVar3 != 0)) {
            pQVar2 = (this->childWindows).d.ptr;
            lVar9 = 0;
            do {
              if (lVar3 << 4 == lVar9) goto LAB_004408a8;
              lVar4 = *(long *)((long)&(pQVar2->wp).d + lVar9);
              if ((lVar4 == 0) || (*(int *)(lVar4 + 4) == 0)) {
                pQVar10 = (QObject *)0x0;
              }
              else {
                pQVar10 = *(QObject **)((long)&(pQVar2->wp).value + lVar9);
              }
              lVar9 = lVar9 + 0x10;
            } while (pQVar10 != pQVar8);
            if (lVar9 != 0) {
              local_40 = pQVar8;
              if (reversed) {
                QtPrivate::QPodArrayOps<QMdiSubWindow*>::emplace<QMdiSubWindow*&>
                          ((QPodArrayOps<QMdiSubWindow*> *)__return_storage_ptr__,0,
                           (QMdiSubWindow **)&local_40);
              }
              else {
                QtPrivate::QPodArrayOps<QMdiSubWindow*>::emplace<QMdiSubWindow*&>
                          ((QPodArrayOps<QMdiSubWindow*> *)__return_storage_ptr__,
                           (__return_storage_ptr__->d).size,(QMdiSubWindow **)&local_40);
                QList<QMdiSubWindow_*>::end(__return_storage_ptr__);
              }
            }
          }
LAB_004408a8:
          lVar12 = lVar12 + 8;
        } while (lVar12 != lVar11);
      }
    }
    else if (order == CreationOrder) {
      pQVar2 = (this->childWindows).d.ptr;
      lVar11 = 0;
      do {
        lVar3 = *(long *)((long)&(pQVar2->wp).d + lVar11);
        if (((lVar3 != 0) && (*(int *)(lVar3 + 4) != 0)) &&
           (pQVar8 = *(QObject **)((long)&(pQVar2->wp).value + lVar11), pQVar8 != (QObject *)0x0)) {
          local_40 = pQVar8;
          if (reversed) {
            QtPrivate::QPodArrayOps<QMdiSubWindow*>::emplace<QMdiSubWindow*&>
                      ((QPodArrayOps<QMdiSubWindow*> *)__return_storage_ptr__,0,
                       (QMdiSubWindow **)&local_40);
          }
          else {
            QtPrivate::QPodArrayOps<QMdiSubWindow*>::emplace<QMdiSubWindow*&>
                      ((QPodArrayOps<QMdiSubWindow*> *)__return_storage_ptr__,
                       (__return_storage_ptr__->d).size,(QMdiSubWindow **)&local_40);
            QList<QMdiSubWindow_*>::end(__return_storage_ptr__);
          }
        }
        lVar11 = lVar11 + 0x10;
      } while (lVar12 << 4 != lVar11);
    }
    else {
      uVar7 = (int)(this->indicesToActivatedChildren).d.size - 1;
      if (-1 < (int)uVar7) {
        lVar12 = (ulong)uVar7 + 1;
        do {
          pQVar2 = (this->childWindows).d.ptr;
          iVar1 = (this->indicesToActivatedChildren).d.ptr[lVar12 + -1];
          pDVar5 = pQVar2[iVar1].wp.d;
          if (((pDVar5 != (Data *)0x0) && (*(int *)(pDVar5 + 4) != 0)) &&
             (pQVar8 = pQVar2[iVar1].wp.value, pQVar8 != (QObject *)0x0)) {
            local_40 = pQVar8;
            if (reversed) {
              QtPrivate::QPodArrayOps<QMdiSubWindow*>::emplace<QMdiSubWindow*&>
                        ((QPodArrayOps<QMdiSubWindow*> *)__return_storage_ptr__,0,
                         (QMdiSubWindow **)&local_40);
            }
            else {
              QtPrivate::QPodArrayOps<QMdiSubWindow*>::emplace<QMdiSubWindow*&>
                        ((QPodArrayOps<QMdiSubWindow*> *)__return_storage_ptr__,
                         (__return_storage_ptr__->d).size,(QMdiSubWindow **)&local_40);
              QList<QMdiSubWindow_*>::end(__return_storage_ptr__);
            }
          }
          lVar11 = lVar12 + -1;
          bVar6 = 0 < lVar12;
          lVar12 = lVar11;
        } while (lVar11 != 0 && bVar6);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QMdiSubWindow*>
QMdiAreaPrivate::subWindowList(QMdiArea::WindowOrder order, bool reversed) const
{
    QList<QMdiSubWindow *> list;
    if (childWindows.isEmpty())
        return list;

    if (order == QMdiArea::CreationOrder) {
        for (QMdiSubWindow *child : childWindows) {
            if (!child)
                continue;
            if (!reversed)
                list.append(child);
            else
                list.prepend(child);
        }
    } else if (order == QMdiArea::StackingOrder) {
        for (QObject *object : viewport->children()) {
            QMdiSubWindow *child = qobject_cast<QMdiSubWindow *>(object);
            if (!child || !childWindows.contains(child))
                continue;
            if (!reversed)
                list.append(child);
            else
                list.prepend(child);
        }
    } else { // ActivationHistoryOrder
        Q_ASSERT(indicesToActivatedChildren.size() == childWindows.size());
        for (int i = indicesToActivatedChildren.size() - 1; i >= 0; --i) {
            QMdiSubWindow *child = childWindows.at(indicesToActivatedChildren.at(i));
            if (!child)
                continue;
            if (!reversed)
                list.append(child);
            else
                list.prepend(child);
        }
    }
    return list;
}